

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qmdisubwindow.cpp
# Opt level: O2

int __thiscall QMdiSubWindow::qt_metacall(QMdiSubWindow *this,Call _c,int _id,void **_a)

{
  uint _id_00;
  Call _c_00;
  
  _id_00 = QWidget::qt_metacall(&this->super_QWidget,_c,_id,_a);
  if ((int)_id_00 < 0) {
    return _id_00;
  }
  if (BindableProperty < _c) {
    return _id_00;
  }
  if ((0x14eU >> (_c & 0x1f) & 1) != 0) {
    qt_static_metacall((QObject *)this,_c,_id_00,_a);
    return _id_00 - 2;
  }
  if (_c == InvokeMetaMethod) {
    if (6 < _id_00) goto LAB_0041cf8f;
    _c_00 = InvokeMetaMethod;
  }
  else {
    if (_c != RegisterMethodArgumentMetaType) {
      return _id_00;
    }
    if (6 < _id_00) goto LAB_0041cf8f;
    _c_00 = RegisterMethodArgumentMetaType;
  }
  qt_static_metacall((QObject *)this,_c_00,_id_00,_a);
LAB_0041cf8f:
  return _id_00 - 7;
}

Assistant:

int QMdiSubWindow::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QWidget::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 7)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 7;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 7)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 7;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 2;
    }
    return _id;
}